

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant.hpp
# Opt level: O0

rt_expression_interface<double> * __thiscall
viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>::substitute
          (rt_constant<long,_viennamath::rt_expression_interface<double>_> *this,
          vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
          *e,vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
             *repl)

{
  uint uVar1;
  int iVar2;
  size_type sVar3;
  const_reference pprVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong local_30;
  size_t i;
  vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
  *repl_local;
  vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
  *e_local;
  rt_constant<long,_viennamath::rt_expression_interface<double>_> *this_local;
  
  local_30 = 0;
  while( true ) {
    sVar3 = std::
            vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
            ::size(e);
    if (sVar3 <= local_30) {
      iVar2 = (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])();
      return (rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar2);
    }
    pprVar4 = std::
              vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
              ::operator[](e,local_30);
    uVar1 = (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[0xb])
                      (this,*pprVar4);
    if ((uVar1 & 1) != 0) break;
    local_30 = local_30 + 1;
  }
  pprVar4 = std::
            vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
            ::operator[](repl,local_30);
  iVar2 = (*(*pprVar4)->_vptr_rt_expression_interface[2])();
  return (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar2);
}

Assistant:

InterfaceType * substitute(std::vector<const InterfaceType *> const &  e,
                                 std::vector<const InterfaceType *> const &  repl) const
      {
        //std::cout << "Comparing variable<" << id << "> with " << e->str() << ", result: ";
        for (size_t i=0; i<e.size(); ++i)
          if (deep_equal(e[i]))
            return repl[i]->clone();

        //std::cout << "FALSE" << std::endl;
        return clone();
      }